

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O2

bool __thiscall
TransitionObservationIndependentMADPDiscrete::SetInitialized
          (TransitionObservationIndependentMADPDiscrete *this,bool b)

{
  pointer ppMVar1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  size_t *psVar5;
  E *this_00;
  undefined7 in_register_00000031;
  pointer ppMVar6;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> _Stack_38;
  
  if ((int)CONCAT71(in_register_00000031,b) == 0) {
    if ((this->_m_initialized != false) && (this->_m_actionStepSizeArray != (size_t *)0x0)) {
      operator_delete__(this->_m_actionStepSizeArray);
    }
    this->_m_initialized = false;
  }
  else {
    if ((this->_m_initialized != false) && (this->_m_actionStepSizeArray != (size_t *)0x0)) {
      operator_delete__(this->_m_actionStepSizeArray);
    }
    lVar2 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x10))(this);
    if (lVar2 == 0) {
      this_00 = (E *)__cxa_allocate_exception(0x28);
      E::E(this_00,
           "TransitionObservationIndependentMADPDiscrete::SetInitialized(bool b) called, but the number of agents has not been set yet.. (is 0 at the moment...)"
          );
      __cxa_throw(this_00,&E::typeinfo,E::~E);
    }
    ppMVar1 = (this->_m_individualMADPDs).
              super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppMVar6 = (this->_m_individualMADPDs).
                   super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppMVar6 != ppMVar1;
        ppMVar6 = ppMVar6 + 1) {
      MultiAgentDecisionProcessDiscrete::Initialize(*ppMVar6);
    }
    uVar3 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x10))(this);
    if (uVar3 < 4) {
      this->_m_jointIndicesCached = true;
    }
    CreateJointActions(this);
    CreateJointStates(this);
    CreateJointObservations(this);
    CreateISD(this);
    sVar4 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x10))(this);
    this->_m_nr_agents = sVar4;
    psVar5 = IndexTools::CalculateStepSize(&this->_m_nrIndivActions);
    this->_m_actionStepSizeArray = psVar5;
    IndexTools::CalculateStepSizeVector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&_Stack_38,
               &this->_m_nrIndivActions);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
              (&this->_m_actionStepSize,&_Stack_38);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&_Stack_38);
    IndexTools::CalculateStepSizeVector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&_Stack_38,
               &this->_m_nrIndivObs);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
              (&this->_m_observationStepSize,&_Stack_38);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&_Stack_38);
    IndexTools::CalculateStepSizeVector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&_Stack_38,
               &this->_m_nrIndivStates);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
              (&this->_m_stateStepSize,&_Stack_38);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&_Stack_38);
    this->_m_initialized = b;
    if (this->_m_jointModelsGenerated == true) {
      if (this->_m_sparse == true) {
        CreateCentralizedSparseModels(this);
      }
      else {
        CreateCentralizedFullModels(this);
      }
    }
  }
  return true;
}

Assistant:

bool TransitionObservationIndependentMADPDiscrete::SetInitialized(bool b)
{
    if(b == false)
    {
        if(_m_initialized == true)
            delete [] _m_actionStepSizeArray;
        _m_initialized = false;
        return(true);
    }
   if(_m_initialized == true && b == true)
   {
       //first free mem before re-initialize:
       delete [] _m_actionStepSizeArray;
   }

    if(DEBUG_TOIMADPD)
        cerr << "TransitionObservationIndependentMADPDiscrete::SetInitialized"<<
        " called - GetNrAgents()="<< GetNrAgents()<<endl;
    
    if(GetNrAgents() < 1 )
        throw E("TransitionObservationIndependentMADPDiscrete::SetInitialized(bool b) called, but the number of agents has not been set yet.. (is 0 at the moment...)");

    if(b == true)
    {
        //first initialize the individual models... 
        vector<MultiAgentDecisionProcessDiscrete*>::iterator it = 
            _m_individualMADPDs.begin();
        vector<MultiAgentDecisionProcessDiscrete*>::iterator last = 
            _m_individualMADPDs.end();
        while(it != last)
        {
            (*it)->Initialize();
            it++;
        }

        // for three agents or less we cache the joint indices
        if(GetNrAgents()<=3)
            _m_jointIndicesCached=true;

        //now perform the necessary actions for this class...
        CreateJointActions();
        CreateJointStates();
        CreateJointObservations();
        
        CreateISD();

        _m_nr_agents=GetNrAgents();
        _m_actionStepSizeArray=IndexTools::CalculateStepSize(_m_nrIndivActions);
        _m_actionStepSize=IndexTools::CalculateStepSizeVector(_m_nrIndivActions);
        _m_observationStepSize=IndexTools::CalculateStepSizeVector(_m_nrIndivObs);
        _m_stateStepSize=IndexTools::CalculateStepSizeVector(_m_nrIndivStates);

        _m_initialized = b;

        if(_m_jointModelsGenerated)
        {
            if(_m_sparse)
                CreateCentralizedSparseModels();
            else
                CreateCentralizedFullModels();
        }


    }
    return(true);
}